

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

qlonglong __thiscall ProString::toLongLong(ProString *this,bool *ok,int base)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  QStringView local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.m_data = (this->m_string).d.ptr;
  local_30.m_size = (this->m_string).d.size;
  local_30 = QStringView::mid(&local_30,(long)this->m_offset,(long)this->m_length);
  qVar1 = QStringView::toLongLong(&local_30,ok,base);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qlonglong toLongLong(bool *ok = nullptr, int base = 10) const { return toQStringView().toLongLong(ok, base); }